

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

PromiseFulfillerPair<kj::HttpClient::Response> *
kj::newPromiseAndFulfiller<kj::HttpClient::Response>(SourceLocation location)

{
  PromiseBase PVar1;
  PromiseFulfillerPair<kj::HttpClient::Response> *in_RDI;
  Own<kj::_::WeakFulfiller<kj::HttpClient::Response>,_std::nullptr_t> wrapper;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_40;
  Own<kj::_::WeakFulfiller<kj::HttpClient::Response>,_std::nullptr_t> local_38;
  PromiseBase local_20;
  
  _::WeakFulfiller<kj::HttpClient::Response>::make();
  _::PromiseDisposer::
  alloc<kj::_::AdapterPromiseNode<kj::HttpClient::Response,kj::_::PromiseAndFulfillerAdapter<kj::HttpClient::Response>>,kj::_::PromiseDisposer,kj::_::WeakFulfiller<kj::HttpClient::Response>&>
            ((PromiseDisposer *)&local_20,local_38.ptr);
  PVar1.node.ptr = local_20.node.ptr;
  local_20.node.ptr = (OwnPromiseNode)(PromiseNode *)0x0;
  Own<kj::_::AdapterPromiseNode<kj::HttpClient::Response,_kj::_::PromiseAndFulfillerAdapter<kj::HttpClient::Response>_>,_kj::_::PromiseDisposer>
  ::dispose((Own<kj::_::AdapterPromiseNode<kj::HttpClient::Response,_kj::_::PromiseAndFulfillerAdapter<kj::HttpClient::Response>_>,_kj::_::PromiseDisposer>
             *)&local_20);
  local_40.ptr = (PromiseNode *)0x0;
  (in_RDI->promise).super_PromiseBase.node.ptr = (PromiseNode *)PVar1.node.ptr;
  local_20.node.ptr = (OwnPromiseNode)(PromiseNode *)0x0;
  (in_RDI->fulfiller).disposer = local_38.disposer;
  (in_RDI->fulfiller).ptr = &(local_38.ptr)->super_PromiseFulfiller<kj::HttpClient::Response>;
  local_38.ptr = (WeakFulfiller<kj::HttpClient::Response> *)0x0;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_20.node);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_40);
  Own<kj::_::WeakFulfiller<kj::HttpClient::Response>,_std::nullptr_t>::dispose(&local_38);
  return in_RDI;
}

Assistant:

PromiseFulfillerPair<T> newPromiseAndFulfiller(SourceLocation location) {
  auto wrapper = _::WeakFulfiller<T>::make();

  _::OwnPromiseNode intermediate(
      _::allocPromise<_::AdapterPromiseNode<
          _::FixVoid<T>, _::PromiseAndFulfillerAdapter<T>>>(*wrapper));
  auto promise = _::PromiseNode::to<_::ReducePromises<T>>(
      _::maybeChain(kj::mv(intermediate), implicitCast<T*>(nullptr), location));

  return PromiseFulfillerPair<T> { kj::mv(promise), kj::mv(wrapper) };
}